

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135> *this)

{
  code *pcVar1;
  long *plVar2;
  CATCH2_INTERNAL_TEST_135 obj;
  
  anon_unknown.dwarf_334836::TestCallback::TestCallback((TestCallback *)&obj);
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFIX40Fixture_002fd5c0;
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture.super_TestCallback.super_NullApplication
  .super_Application._vptr_Application = (Application)&PTR__sessionFIX40Fixture_002fd618;
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture._1592_8_ = FIX::SocketServer::accept;
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture.object = (Session *)0x0;
  anon_unknown.dwarf_334836::sessionFIX40Fixture::createSession((sessionFIX40Fixture *)&obj,1,-1,-1)
  ;
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFIX40Fixture_002fd4c8;
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture.super_TestCallback.super_NullApplication
  .super_Application._vptr_Application = (Application)&PTR__CATCH2_INTERNAL_TEST_135_002fd520;
  pcVar1 = (code *)this->m_testAsMethod;
  plVar2 = (long *)((long)&(((sessionFIX40Fixture *)&obj)->super_TestCallback).super_Responder.
                           _vptr_Responder + *(long *)&this->field_0x10);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)(plVar2);
  anon_unknown.dwarf_334836::sessionFIX40Fixture::~sessionFIX40Fixture((sessionFIX40Fixture *)&obj);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }